

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O0

_Bool sesschan_change_window_size(Channel *chan,uint width,uint height,uint pixwidth,uint pixheight)

{
  sesschan *sess;
  uint pixheight_local;
  uint pixwidth_local;
  uint height_local;
  uint width_local;
  Channel *chan_local;
  
  if (((ulong)chan[-0x5a].vt & 1) == 0) {
    chan_local._7_1_ = false;
  }
  else {
    *(uint *)&chan[-9].vt = width;
    *(uint *)((long)&chan[-9].vt + 4) = height;
    chan[-9].initial_fixed_window_size = pixwidth;
    *(uint *)&chan[-9].field_0xc = pixheight;
    if (*(long *)&chan[-5].initial_fixed_window_size != 0) {
      backend_size(*(Backend **)&chan[-5].initial_fixed_window_size,*(int *)&chan[-9].vt,
                   *(int *)((long)&chan[-9].vt + 4));
    }
    chan_local._7_1_ = true;
  }
  return chan_local._7_1_;
}

Assistant:

bool sesschan_change_window_size(
    Channel *chan, unsigned width, unsigned height,
    unsigned pixwidth, unsigned pixheight)
{
    sesschan *sess = container_of(chan, sesschan, chan);

    if (!sess->want_pty)
        return false;

    sess->wc = width;
    sess->hc = height;
    sess->wp = pixwidth;
    sess->hp = pixheight;

    if (sess->backend)
        backend_size(sess->backend, sess->wc, sess->hc);

    return true;
}